

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joypad.c
# Opt level: O0

Result joypad_read(FileData *file_data,JoypadBuffer **out_buffer)

{
  JoypadState *pJVar1;
  ulong capacity;
  ulong *puVar2;
  JoypadBuffer *pJVar3;
  JoypadChunk *pJVar4;
  JoypadChunk *new_chunk;
  JoypadBuffer *buffer;
  size_t j;
  Ticks ticks;
  JoypadState *state;
  Ticks last_ticks;
  size_t i;
  size_t size;
  JoypadBuffer **out_buffer_local;
  FileData *file_data_local;
  
  if ((file_data->size & 0xf) == 0) {
    capacity = file_data->size >> 4;
    state = (JoypadState *)0x0;
    for (last_ticks = 0; last_ticks < capacity; last_ticks = last_ticks + 1) {
      puVar2 = (ulong *)(file_data->data + last_ticks * 0x10);
      pJVar1 = (JoypadState *)*puVar2;
      if (pJVar1 < state) {
        fprintf(_stderr,"%s:%d: ",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/joypad.c",0xf0
               );
        fprintf(_stderr,"Expected ticks to be sorted, got %lu then %lu\n",state,pJVar1);
        goto LAB_001245f5;
      }
      for (buffer = (JoypadBuffer *)0x0; buffer < (JoypadBuffer *)0x7;
          buffer = (JoypadBuffer *)((long)&(buffer->sentinel).data + 1)) {
        if (*(char *)((long)puVar2 + (long)((long)&(buffer->sentinel).size + 1)) != '\0') {
          fprintf(_stderr,"%s:%d: ",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/joypad.c",
                  0xf4);
          fprintf(_stderr,"Expected padding to be zero, got %u\n",
                  (ulong)*(byte *)((long)puVar2 + last_ticks + 9));
          goto LAB_001245f5;
        }
      }
      state = pJVar1;
    }
    pJVar3 = (JoypadBuffer *)calloc(1,0x48);
    pJVar4 = alloc_joypad_chunk(capacity);
    memcpy(pJVar4->data,file_data->data,file_data->size);
    pJVar4->size = capacity;
    pJVar4->next = (JoypadChunk *)pJVar3;
    pJVar4->prev = (JoypadChunk *)pJVar3;
    (pJVar3->sentinel).next = pJVar4;
    (pJVar3->sentinel).prev = pJVar4;
    *out_buffer = pJVar3;
    file_data_local._4_4_ = OK;
  }
  else {
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/joypad.c",0xe7);
    fprintf(_stderr,"Expected joypad file size to be multiple of %zu\n",0x10);
LAB_001245f5:
    file_data_local._4_4_ = ERROR;
  }
  return file_data_local._4_4_;
}

Assistant:

Result joypad_read(const FileData* file_data, JoypadBuffer** out_buffer) {
  CHECK_MSG(file_data->size % sizeof(JoypadState) == 0,
            "Expected joypad file size to be multiple of %zu\n",
            sizeof(JoypadState));
  size_t size = file_data->size / sizeof(JoypadState);
  size_t i;
  Ticks last_ticks = 0;
  for (i = 0; i < size; ++i) {
    JoypadState* state = (JoypadState*)file_data->data + i;
    Ticks ticks = state->ticks;
    CHECK_MSG(ticks >= last_ticks,
              "Expected ticks to be sorted, got %" PRIu64 " then %" PRIu64 "\n",
              last_ticks, ticks);
    size_t j;
    for (j = 0; j < ARRAY_SIZE(state->padding); ++j) {
      CHECK_MSG(state->padding[j] == 0, "Expected padding to be zero, got %u\n",
                state->padding[i]);
    }
    last_ticks = ticks;
  }

  JoypadBuffer* buffer = xcalloc(1, sizeof(JoypadBuffer));
  JoypadChunk* new_chunk = alloc_joypad_chunk(size);
  memcpy(new_chunk->data, file_data->data, file_data->size);
  new_chunk->size = size;
  new_chunk->prev = new_chunk->next = &buffer->sentinel;
  buffer->sentinel.prev = buffer->sentinel.next = new_chunk;
  *out_buffer = buffer;
  return OK;
  ON_ERROR_RETURN;
}